

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O2

Vec_Bit_t * Sbc_ManCriticalPath(Gia_Man_t *p)

{
  int LevelFan;
  int iObj;
  Vec_Bit_t *vPath;
  Gia_Obj_t *pObj;
  int v;
  int *pLevels;
  
  pLevels = (int *)0x0;
  if (p->pManTime == (void *)0x0) {
    LevelFan = Gia_ManLutLevel(p,&pLevels);
  }
  else {
    LevelFan = Gia_ManLutLevelWithBoxes(p);
  }
  vPath = Vec_BitStart(p->nObjs);
  if (p->pManTime != (void *)0x0) {
    pLevels = p->vLevels->pArray;
  }
  Gia_ManIncrementTravId(p);
  for (v = 0; v < p->vCos->nSize; v = v + 1) {
    pObj = Gia_ManCo(p,v);
    iObj = Gia_ObjFaninId0p(p,pObj);
    if ((iObj != 0) && (pLevels[iObj] == LevelFan)) {
      Sbc_ManCriticalPath_rec(p,pLevels,iObj,LevelFan,vPath,1);
    }
  }
  if (pLevels != (int *)0x0 && p->pManTime == (void *)0x0) {
    free(pLevels);
    pLevels = (int *)0x0;
  }
  Sbc_ManAddInternalToPath(p,vPath);
  return vPath;
}

Assistant:

Vec_Bit_t * Sbc_ManCriticalPath( Gia_Man_t * p )
{
    int * pLevels = NULL, k, iDriver, Slack = 1;
    int nLevels = p->pManTime ? Gia_ManLutLevelWithBoxes(p) : Gia_ManLutLevel(p, &pLevels);
    Vec_Bit_t * vPath = Vec_BitStart( Gia_ManObjNum(p) );
    if ( p->pManTime )
        pLevels = Vec_IntArray( p->vLevels );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoDriverId( p, iDriver, k )
        if ( (pLevels[iDriver] == nLevels) && iDriver )
            Sbc_ManCriticalPath_rec( p, pLevels, iDriver, pLevels[iDriver], vPath, Slack );
    if ( !p->pManTime )
        ABC_FREE( pLevels );
    Sbc_ManAddInternalToPath( p, vPath );
    return vPath;
}